

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-create.c
# Opt level: O1

cn_cbor * cn_cbor_data_create(uint8_t *data,int len,cn_cbor_errback *errp)

{
  cn_cbor *pcVar1;
  
  if (errp != (cn_cbor_errback *)0x0) {
    errp->err = CN_CBOR_NO_ERROR;
  }
  pcVar1 = (cn_cbor *)calloc(1,0x38);
  if (pcVar1 == (cn_cbor *)0x0) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
    }
    pcVar1 = (cn_cbor *)0x0;
  }
  else {
    pcVar1->type = CN_CBOR_BYTES;
    pcVar1->length = len;
    (pcVar1->v).bytes = data;
  }
  return pcVar1;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_data_create(const uint8_t* data, int len
                             CBOR_CONTEXT,
                             cn_cbor_errback *errp)
{
  cn_cbor* ret;
  INIT_CB(ret);

  ret->type = CN_CBOR_BYTES;
  ret->length = len;
  ret->v.str = (const char*) data; // TODO: add v.ustr to the union?

  return ret;
}